

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# costas.cc
# Opt level: O0

void __thiscall Costas::work(Costas *this,size_t nsamples,complex<float> *fi,complex<float> *fo)

{
  long in_RCX;
  ulong in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  float frac;
  float err;
  size_t j_2;
  float terr;
  size_t j_1;
  size_t j;
  complex<float> sincos [4];
  float phase [4];
  size_t i;
  complex<float> *in_stack_ffffffffffffff38;
  complex<float> *local_98;
  ulong local_80;
  float local_74;
  ulong local_68;
  ulong local_60;
  complex<float> local_58 [4];
  undefined8 local_38;
  float local_30;
  float local_2c;
  ulong local_28;
  long local_20;
  ulong local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 4) {
    local_38._0_4_ = -(in_RDI[1] * 0.0 + *in_RDI);
    local_38._4_4_ = -(in_RDI[1] + *in_RDI);
    local_30 = -(in_RDI[1] + in_RDI[1] + *in_RDI);
    local_2c = -(in_RDI[1] * 3.0 + *in_RDI);
    local_98 = local_58;
    do {
      std::complex<float>::complex(local_98,0.0,0.0);
      local_98 = local_98 + 1;
    } while (local_98 != (complex<float> *)&local_38);
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      fVar1 = cosf(*(float *)((long)&local_38 + local_60 * 4));
      std::complex<float>::real(local_58 + local_60,fVar1);
      fVar1 = sinf(*(float *)((long)&local_38 + local_60 * 4));
      std::complex<float>::imag(local_58 + local_60,fVar1);
    }
    for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
      std::operator*(in_stack_ffffffffffffff38,(complex<float> *)0x1bcd52);
      *(undefined8 *)(local_20 + (local_28 + local_68) * 8) = extraout_XMM0_Qa;
    }
    local_74 = 0.0;
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      fVar1 = std::complex<float>::real_abi_cxx11_
                        ((complex<float> *)(local_20 + (local_28 + local_80) * 8));
      fVar2 = std::complex<float>::imag_abi_cxx11_
                        ((complex<float> *)(local_20 + (local_28 + local_80) * 8));
      local_74 = ((ABS(fVar1 * fVar2 + 1.0) - ABS(fVar1 * fVar2 - 1.0)) * 0.5) / 4.0 + local_74;
    }
    in_RDI[1] = in_RDI[3] * local_74 + in_RDI[1];
    *in_RDI = in_RDI[2] * local_74 + in_RDI[1] + *in_RDI;
    in_RDI[1] = (ABS(in_RDI[1] + in_RDI[4]) - ABS(in_RDI[1] - in_RDI[4])) * 0.5;
    if ((6.2831855 < *in_RDI) || (*in_RDI < -6.2831855)) {
      *in_RDI = (*in_RDI * 0.15915494 - (float)(int)(*in_RDI * 0.15915494)) * 6.2831855;
    }
  }
  return;
}

Assistant:

void Costas::work(
    size_t nsamples,
    std::complex<float>* fi,
    std::complex<float>* fo) {
  for (size_t i = 0; i < nsamples; i += 4) {
    float phase[4] = {
      -(phase_ + 0 * freq_),
      -(phase_ + 1 * freq_),
      -(phase_ + 2 * freq_),
      -(phase_ + 3 * freq_),
    };

    // Compute sin/cos for phase offset
    std::complex<float> sincos[4];
    for (size_t j = 0; j < 4; j++) {
      sincos[j].real(cosf(phase[j]));
      sincos[j].imag(sinf(phase[j]));
    }

    // Complex multiplication
    for (size_t j = 0; j < 4; j++) {
      fo[i + j] = fi[i + j] * sincos[j];
    }

    // Phase detector is executed for all samples,
    // Clip resulting value to [-1.0f, 1.0f].
    // Total error is average of 4 errors.
    float terr = 0.0f;
    for (size_t j = 0; j < 4; j++) {
      float err = fo[i + j].real() * fo[i + j].imag();
      terr += (0.5f * (fabsf(err + 1.0f) - fabsf(err - 1.0f))) / 4.0f;
    }

    // Update frequency and phase
    freq_ += beta_ * terr;
    phase_ += alpha_ * terr + freq_;

    // Clamp frequency
    freq_ = (0.5f * (fabsf(freq_ + maxDeviation_) -
                     fabsf(freq_ - maxDeviation_)));

    // Wrap phase if needed
    if (phase_ > M_2PI || phase_ < -M_2PI) {
      float frac = phase_ * (1.0 / M_2PI);
      phase_ = (frac - (float)((int)frac)) * M_2PI;
    }
  }
}